

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sourceCode.c
# Opt level: O1

void sysbvm_sourceCode_computeLineAndColumnForIndex
               (sysbvm_context_t *context,sysbvm_tuple_t sourceCode,sysbvm_tuple_t index,
               uint32_t *outLine,uint32_t *outColumn)

{
  sysbvm_tuple_t orderedCollection;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  sysbvm_tuple_t element;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  uint32_t uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  bool bVar12;
  
  uVar1 = *(ulong *)(sourceCode + 0x40);
  if (uVar1 == 0) {
    orderedCollection = sysbvm_orderedCollection_create(context);
    uVar1 = *(ulong *)(sourceCode + 0x10);
    if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
      uVar2 = (ulong)*(uint *)(uVar1 + 0xc);
    }
    else {
      uVar2 = 0;
    }
    sysbvm_orderedCollection_add(context,orderedCollection,9);
    if (uVar2 != 0) {
      element = 0x19;
      uVar4 = 0;
      do {
        if (*(char *)(uVar1 + 0x10 + uVar4) == '\n') {
          sysbvm_orderedCollection_add(context,orderedCollection,element);
        }
        uVar4 = uVar4 + 1;
        element = element + 0x10;
      } while (uVar2 != uVar4);
    }
    uVar1 = sysbvm_orderedCollection_asArray(context,orderedCollection);
    *(ulong *)(sourceCode + 0x40) = uVar1;
  }
  bVar12 = (uVar1 & 0xf) != 0;
  if (bVar12 || uVar1 == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = (ulong)(*(uint *)(uVar1 + 0xc) >> 3);
  }
  if (index == 0 || (index & 0xf) != 0) {
    uVar11 = (uint)(index >> 4);
  }
  else {
    uVar11 = *(uint *)(index + 0x10);
  }
  if (uVar2 == 0) {
    uVar7 = 1;
    iVar5 = 0;
  }
  else {
    uVar4 = 0;
    uVar8 = 0;
    uVar6 = 0;
    do {
      uVar9 = (uVar2 - uVar4 >> 1) + uVar4;
      if (bVar12 || uVar1 == 0) {
        uVar10 = 0;
      }
      else {
        uVar10 = *(ulong *)(uVar1 + 0x10 + uVar9 * 8);
      }
      if (uVar10 == 0 || (uVar10 & 0xf) != 0) {
        uVar10 = uVar10 >> 4;
      }
      else {
        uVar10 = (ulong)*(uint *)(uVar10 + 0x10);
      }
      uVar3 = uVar9;
      if ((uint)uVar10 <= uVar11) {
        uVar6 = uVar10 & 0xffffffff;
        uVar4 = uVar9 + 1;
        uVar3 = uVar2;
        uVar8 = uVar9;
      }
      iVar5 = (int)uVar6;
      uVar2 = uVar3;
    } while (uVar4 < uVar3);
    uVar7 = (int)uVar8 + 1;
  }
  if (outLine != (uint32_t *)0x0) {
    *outLine = uVar7;
  }
  if (outColumn != (uint32_t *)0x0) {
    *outColumn = (uVar11 - iVar5) + 1;
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_sourceCode_computeLineAndColumnForIndex(sysbvm_context_t *context, sysbvm_tuple_t sourceCode, sysbvm_tuple_t index, uint32_t *outLine, uint32_t *outColumn)
{
    // Make sure the line start index table is built.
    sysbvm_tuple_t indexTable = sysbvm_sourceCode_ensureLineStartIndexTableIsBuilt(context, sourceCode);

    // Perform a binary search.
    size_t indexTableSize = sysbvm_array_getSize(indexTable);
    size_t indexValue = sysbvm_tuple_uint32_decode(index);

    size_t left = 0;
    size_t right = indexTableSize;
    size_t bestSoFar = 0;
    size_t bestIndexSoFar = 0;
    while(left < right)
    {
        size_t middle = left + (right - left) / 2;
        size_t middleIndex = sysbvm_tuple_uint32_decode(sysbvm_array_at(indexTable, middle));
        if(middleIndex <= indexValue)
        {
            bestSoFar = middle;
            bestIndexSoFar = middleIndex;
            left = middle + 1;
        }
        else if(middleIndex > indexValue)
        {
            right = middle;
        }
    }

    size_t line = bestSoFar + 1;
    size_t column = indexValue - bestIndexSoFar + 1;

    // Emit the result.
    if(outLine)
        *outLine = line;
    if(outColumn)
        *outColumn = column;
}